

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::colPresolve(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_00;
  int in_EDX;
  int __c;
  iterator *rhs;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar11;
  double dVar12;
  double dVar13;
  HPresolve *extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  HighsInt in_stack_0000001c;
  double in_stack_00000020;
  HighsInt in_stack_0000002c;
  HPresolve *in_stack_00000030;
  HighsSliceNonzero *nonzero;
  iterator __end2;
  iterator __begin2;
  HPresolve *in_stack_000000d0;
  HighsTripletListSlice *__range2;
  HighsInt nzPos_1;
  HighsInt row_1;
  HighsInt nzPos;
  HighsInt row;
  bool dualConsHasLower;
  bool dualConsHasUpper;
  Result __result;
  double boundDiff;
  bool logging_on;
  HighsInt in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  HPresolve *in_stack_fffffffffffffec8;
  HighsInt in_stack_fffffffffffffed0;
  HighsInt in_stack_fffffffffffffed4;
  HPresolve *in_stack_fffffffffffffed8;
  HPresolve *in_stack_fffffffffffffee0;
  HighsInt in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  value_type vVar14;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  HPresolve *in_stack_ffffffffffffff30;
  HighsInt in_stack_ffffffffffffff38;
  HighsInt in_stack_ffffffffffffff3c;
  HPresolve *in_stack_ffffffffffffff40;
  HighsInt *in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff50;
  HighsInt in_stack_ffffffffffffff5c;
  HighsPostsolveStack *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff8b;
  HighsInt in_stack_ffffffffffffff8c;
  HighsPostsolveStack *in_stack_ffffffffffffff90;
  HPresolve *in_stack_ffffffffffffff98;
  HighsInt in_stack_ffffffffffffffa4;
  int row_00;
  HighsInt in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  
  HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
  dVar12 = *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
  dVar12 = dVar12 - *pvVar7;
  if ((dVar12 <= (double)in_RDI[4]) &&
     ((dVar12 <= *(double *)(in_RDI[1] + 0x108) ||
      (dVar13 = getMaxAbsColVal(in_stack_ffffffffffffff30,(HighsInt)((ulong)in_RDI >> 0x20)),
      dVar13 * dVar12 <= (double)in_RDI[4])))) {
    HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    if (dVar12 < -(double)in_RDI[4]) {
      return kPrimalInfeasible;
    }
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)in_EDX);
    getColumnVector(in_stack_fffffffffffffee0,HVar5);
    HighsPostsolveStack::removedFixedCol<HighsTripletListSlice>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
               (double)in_stack_ffffffffffffff48,
               (HighsMatrixSlice<HighsTripletListSlice> *)in_stack_ffffffffffffff40);
    removeFixedCol((HPresolve *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec);
    RVar4 = checkLimits((HPresolve *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (HighsPostsolveStack *)in_stack_ffffffffffffff30);
    return RVar4;
  }
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)in_EDX);
  if (*pvVar8 == 0) {
    RVar4 = emptyCol(in_stack_fffffffffffffec8,
                     (HighsPostsolveStack *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),HVar5);
    return RVar4;
  }
  if (*pvVar8 == 1) {
    RVar4 = singletonCol((HPresolve *)CONCAT44(1,in_stack_fffffffffffffef8),
                         (HighsPostsolveStack *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffeec);
    return RVar4;
  }
  RVar4 = detectDominatedCol(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff8c,(bool)in_stack_ffffffffffffff8b);
  if (RVar4 != kOk) {
    return RVar4;
  }
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                      (long)in_EDX);
  if (*pvVar9 != '\0') {
    return kOk;
  }
  bVar1 = isUpperImplied((HPresolve *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         HVar5);
  bVar2 = isLowerImplied((HPresolve *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         HVar5);
  if (in_RDI[3] == 0) goto LAB_00706bc8;
  if ((((bVar2) &&
       (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)in_EDX),
       *pvVar8 != -1)) &&
      (HVar5 = HighsLinearSumBounds::getNumInfSumUpperOrig
                         ((HighsLinearSumBounds *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffeac), HVar5 == 1)) &&
     (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)in_EDX),
     0.0 <= *pvVar7)) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)in_EDX);
    in_stack_ffffffffffffffac = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                        (long)in_stack_ffffffffffffffac);
    if ((*pvVar7 != -INFINITY) || (NAN(*pvVar7))) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                          (long)in_stack_ffffffffffffffac);
      if ((*pvVar7 != INFINITY) || (NAN(*pvVar7))) goto LAB_00706679;
    }
    in_stack_ffffffffffffffa8 =
         findNonzero(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
    pvVar10 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                        ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                         (long)in_EDX);
    if (*pvVar10 == kInteger) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),
                          (long)in_stack_ffffffffffffffac);
      vVar14 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),
                          (long)in_stack_ffffffffffffffac);
      if (vVar14 == *pvVar8) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),
                   (long)in_stack_ffffffffffffffa8);
        bVar3 = rowCoefficientsIntegral
                          ((HPresolve *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa4,(double)in_stack_ffffffffffffff98);
        if (bVar3) goto LAB_0070660f;
      }
    }
    else {
LAB_0070660f:
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),
                          (long)in_stack_ffffffffffffffa8);
      if (*pvVar7 <= 0.0) {
        changeImplRowDualUpper
                  (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
      }
      else {
        changeImplRowDualLower
                  (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
      }
    }
  }
LAB_00706679:
  if (((bVar1) &&
      (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)in_EDX),
      *pvVar8 != -1)) &&
     ((HVar5 = HighsLinearSumBounds::getNumInfSumLowerOrig
                         ((HighsLinearSumBounds *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffeac), HVar5 == 1 &&
      (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)in_EDX),
      *pvVar7 <= 0.0)))) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)in_EDX);
    row_00 = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)row_00);
    if ((*pvVar7 != -INFINITY) || (NAN(*pvVar7))) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)row_00);
      if ((*pvVar7 != INFINITY) || (NAN(*pvVar7))) goto LAB_007068d5;
    }
    HVar5 = findNonzero(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                        in_stack_fffffffffffffed0);
    pvVar10 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                        ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                         (long)in_EDX);
    if (*pvVar10 == kInteger) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),(long)row_00);
      vVar14 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)row_00);
      if (vVar14 == *pvVar8) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)HVar5);
        bVar3 = rowCoefficientsIntegral
                          ((HPresolve *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),row_00,
                           (double)in_stack_ffffffffffffff98);
        if (bVar3) goto LAB_0070686b;
      }
    }
    else {
LAB_0070686b:
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)HVar5);
      if (*pvVar7 <= 0.0) {
        changeImplRowDualLower
                  (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
      }
      else {
        changeImplRowDualUpper
                  (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
      }
    }
  }
LAB_007068d5:
  convertImpliedInteger
            ((HPresolve *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (HighsInt)((ulong)in_stack_ffffffffffffff30 >> 0x20),
             (HighsInt)in_stack_ffffffffffffff30,SUB81((ulong)in_RDI >> 0x38,0));
  pvVar10 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                      ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                       (long)in_EDX);
  if (*pvVar10 != kContinuous) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
    if ((*pvVar7 != 0.0) || (NAN(*pvVar7))) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
      if ((*pvVar7 == -INFINITY) && (!NAN(*pvVar7))) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX
                           );
        if ((*pvVar7 == INFINITY) && (!NAN(*pvVar7))) goto LAB_00706b92;
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
      in_stack_fffffffffffffee0 = (HPresolve *)*pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
      if (0.5 < (double)in_stack_fffffffffffffee0 - *pvVar7) {
        pvVar11 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38);
        std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)in_EDX);
        std::abs((int)pvVar11);
        pvVar11 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20);
        in_stack_fffffffffffffed8 = extraout_XMM0_Qa;
        std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)in_EDX);
        std::abs((int)pvVar11);
        if ((double)in_stack_fffffffffffffed8 <= extraout_XMM0_Qa_00) {
          pvVar11 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)in_EDX);
          std::abs((int)pvVar11);
          if (extraout_XMM0_Qa_02 < 1000.5) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
            transformColumn(in_stack_000000d0,(HighsPostsolveStack *)__begin2._24_8_,
                            __begin2.nodeNext._4_4_,(double)__begin2.pos_.value_,
                            (double)__begin2.pos_.index_);
          }
        }
        else {
          pvVar11 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)in_EDX);
          std::abs((int)pvVar11);
          if (extraout_XMM0_Qa_01 < 1000.5) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
            transformColumn(in_stack_000000d0,(HighsPostsolveStack *)__begin2._24_8_,
                            __begin2.nodeNext._4_4_,(double)__begin2.pos_.value_,
                            (double)__begin2.pos_.index_);
          }
        }
      }
    }
  }
LAB_00706b92:
  pvVar10 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                      ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                       (long)in_EDX);
  if (*pvVar10 == kInteger) {
    return kOk;
  }
LAB_00706bc8:
  HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (((bVar2) &&
      (HVar6 = HighsLinearSumBounds::getNumInfSumUpper
                         ((HighsLinearSumBounds *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffeac), HVar6 < 2)) ||
     ((bVar1 && (HVar6 = HighsLinearSumBounds::getNumInfSumLower
                                   ((HighsLinearSumBounds *)
                                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                    in_stack_fffffffffffffeac), HVar6 < 2)))) {
    getColumnVector(in_stack_fffffffffffffee0,HVar5);
    HighsMatrixSlice<HighsTripletListSlice>::begin
              ((HighsMatrixSlice<HighsTripletListSlice> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    HighsMatrixSlice<HighsTripletListSlice>::end
              ((HighsMatrixSlice<HighsTripletListSlice> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    while( true ) {
      rhs = (iterator *)&stack0xffffffffffffff38;
      bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=
                        ((iterator *)&stack0xffffffffffffff58,rhs);
      if (!bVar1) break;
      this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*
                          ((iterator *)&stack0xffffffffffffff58);
      HighsSliceNonzero::index(this_00,(char *)rhs,__c);
      HighsSliceNonzero::value(this_00);
      updateRowDualImpliedBounds
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                 (double)this_00);
      HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++
                ((iterator *)&stack0xffffffffffffff58);
    }
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::colPresolve(HighsPostsolveStack& postsolve_stack,
                                         HighsInt col) {
  assert(!colDeleted[col]);
  const bool logging_on = analysis_.logging_on_;
  double boundDiff = model->col_upper_[col] - model->col_lower_[col];
  if (boundDiff <= primal_feastol) {
    if (boundDiff <= options->small_matrix_value ||
        getMaxAbsColVal(col) * boundDiff <= primal_feastol) {
      if (boundDiff < -primal_feastol) return Result::kPrimalInfeasible;
      postsolve_stack.removedFixedCol(col, model->col_lower_[col],
                                      model->col_cost_[col],
                                      getColumnVector(col));
      removeFixedCol(col);
      return checkLimits(postsolve_stack);
    }
  }

  switch (colsize[col]) {
    case 0:
      return emptyCol(postsolve_stack, col);
    case 1:
      return singletonCol(postsolve_stack, col);
    default:
      break;
  }

  // detect strong / weak domination
  HPRESOLVE_CHECKED_CALL(detectDominatedCol(postsolve_stack, col));
  if (colDeleted[col]) return Result::kOk;

  // column is not (weakly) dominated

  // the associated dual constraint has an upper bound if there is an infinite
  // or redundant column lower bound as then the reduced cost of the column must
  // not be positive i.e. <= 0
  bool dualConsHasUpper = isUpperImplied(col);
  bool dualConsHasLower = isLowerImplied(col);

  // integer columns cannot be used to tighten bounds on dual multipliers
  if (mipsolver != nullptr) {
    if (dualConsHasLower && colLowerSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumUpperOrig(col) == 1 &&
        model->col_cost_[col] >= 0) {
      HighsInt row = colLowerSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualLower(row, 0.0, col);
          else
            changeImplRowDualUpper(row, 0.0, col);
        }
      }
    }

    if (dualConsHasUpper && colUpperSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumLowerOrig(col) == 1 &&
        model->col_cost_[col] <= 0) {
      HighsInt row = colUpperSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualUpper(row, 0.0, col);
          else
            changeImplRowDualLower(row, 0.0, col);
        }
      }
    }

    convertImpliedInteger(col);

    // shift integral variables to have a lower bound of zero
    if (model->integrality_[col] != HighsVarType::kContinuous &&
        model->col_lower_[col] != 0.0 &&
        (model->col_lower_[col] != -kHighsInf ||
         model->col_upper_[col] != kHighsInf) &&
        model->col_upper_[col] - model->col_lower_[col] > 0.5) {
      // substitute with the bound that is smaller in magnitude and only
      // substitute if bound is not large for an integer
      if (std::abs(model->col_upper_[col]) > std::abs(model->col_lower_[col])) {
        if (std::abs(model->col_lower_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, 1.0, model->col_lower_[col]);
      } else {
        if (std::abs(model->col_upper_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, -1.0, model->col_upper_[col]);
      }
    }

    if (model->integrality_[col] == HighsVarType::kInteger) return Result::kOk;
  }

  // now check if we can expect to tighten at least one bound
  if ((dualConsHasLower && impliedDualRowBounds.getNumInfSumUpper(col) <= 1) ||
      (dualConsHasUpper && impliedDualRowBounds.getNumInfSumLower(col) <= 1)) {
    for (const HighsSliceNonzero& nonzero : getColumnVector(col))
      updateRowDualImpliedBounds(nonzero.index(), col, nonzero.value());
  }

  return Result::kOk;
}